

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVector<ImGuiViewport_*> *pIVar2;
  ImVec2 *pIVar3;
  ImVec2 IVar4;
  bool bVar5;
  ImGuiContextHook *pIVar6;
  _func_void_ImGuiViewport_ptr_ImVec2 *p_Var7;
  ImGuiViewportP *pIVar8;
  ImVec2 IVar9;
  ImGuiWindow *pIVar10;
  unsigned_short *puVar11;
  ImVec2 IVar12;
  undefined1 auVar13 [16];
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  ImU32 IVar23;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar24;
  ImDrawList *pIVar25;
  ImGuiWindow **ppIVar26;
  ImGuiViewport *pIVar27;
  ImGuiViewport **ppIVar28;
  ImGuiViewport **ppIVar29;
  ImGuiWindow **ppIVar30;
  unsigned_short *__dest;
  byte bVar31;
  ImGuiContext *g_4;
  char *pcVar32;
  char *label;
  char *pcVar33;
  ImGuiWindow *pIVar34;
  ImGuiContext *g;
  byte bVar35;
  int iVar36;
  ulong uVar37;
  ImGuiContext *g_2;
  ulong uVar38;
  ImGuiWindow *window;
  long lVar39;
  ImGuiContext *ctx;
  long lVar40;
  uint uVar41;
  int iVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  ImRect inner;
  ImRect outer;
  undefined1 local_a8 [12];
  float fStack_9c;
  undefined1 local_98 [16];
  ImGuiContext *local_80;
  ImVec2 local_78;
  undefined8 uStack_70;
  ImVec2 local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  pIVar20 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1188,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x118d,"void ImGui::EndFrame()");
  }
  iVar42 = (GImGui->Hooks).Size;
  if (0 < iVar42) {
    lVar39 = 0;
    lVar40 = 0;
    do {
      pIVar6 = (pIVar20->Hooks).Data;
      if (*(int *)(pIVar6 + lVar39) == 2) {
        (**(code **)(pIVar6 + lVar39 + 8))(pIVar20,pIVar6 + lVar39);
        iVar42 = (pIVar20->Hooks).Size;
      }
      lVar40 = lVar40 + 1;
      lVar39 = lVar39 + 0x18;
    } while (lVar40 < iVar42);
  }
  bVar5 = (GImGui->IO).KeyCtrl;
  uVar41 = bVar5 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar41 = (uint)bVar5;
  }
  uVar43 = uVar41 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar43 = uVar41;
  }
  uVar41 = uVar43 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar41 = uVar43;
  }
  if ((uVar41 != 0) && ((GImGui->IO).KeyMods != uVar41)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1df1,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar42 = (GImGui->CurrentWindowStack).Size;
  if (iVar42 != 1) {
    if (1 < iVar42) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x1dfd,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e03,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((GImGui->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                  ,0x1e07,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var7 = (pIVar20->PlatformIO).Platform_SetImeInputPos;
  if (p_Var7 != (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
    fVar44 = (pIVar20->PlatformImeLastPos).x;
    if ((((fVar44 == 3.4028235e+38) && (!NAN(fVar44))) ||
        (fVar44 = (pIVar20->PlatformImePos).x - fVar44,
        fVar45 = (pIVar20->PlatformImePos).y - (pIVar20->PlatformImeLastPos).y,
        0.0001 < fVar44 * fVar44 + fVar45 * fVar45)) &&
       ((pIVar8 = pIVar20->PlatformImePosViewport, pIVar8 != (ImGuiViewportP *)0x0 &&
        (pIVar8->PlatformWindowCreated == true)))) {
      (*p_Var7)(&pIVar8->super_ImGuiViewport,pIVar20->PlatformImePos);
      pIVar20->PlatformImeLastPos = pIVar20->PlatformImePos;
      pIVar20->PlatformImePosViewport = (ImGuiViewportP *)0x0;
    }
  }
  pIVar20->WithinFrameScopeWithImplicitWindow = false;
  local_80 = pIVar20;
  pIVar24 = pIVar20->CurrentWindow;
  if ((pIVar24 != (ImGuiWindow *)0x0) && (pIVar24->WriteAccessed == false)) {
    pIVar24->Active = false;
  }
  End();
  pIVar20 = GImGui;
  pIVar24 = GetTopMostPopupModal();
  IVar9 = (ImVec2)pIVar20->NavWindowingTargetAnim;
  if (pIVar24 != (ImGuiWindow *)0x0 || IVar9 != (ImVec2)0x0) {
    iVar42 = (pIVar20->Viewports).Size;
    local_78 = IVar9;
    if (0 < iVar42) {
      lVar39 = 0;
      local_98._0_8_ = (0x36 - (ulong)(pIVar24 == (ImGuiWindow *)0x0)) * 0x10;
      do {
        pIVar8 = (pIVar20->Viewports).Data[lVar39];
        if ((((pIVar24 == (ImGuiWindow *)0x0) || (pIVar8 != pIVar24->Viewport)) &&
            ((pIVar20->NavWindowingListWindow == (ImGuiWindow *)0x0 ||
             (pIVar8 != pIVar20->NavWindowingListWindow->Viewport)))) &&
           ((pIVar20->NavWindowingTargetAnim == (ImGuiWindow *)0x0 ||
            (pIVar8 != pIVar20->NavWindowingTargetAnim->Viewport)))) {
          if ((pIVar24 != (ImGuiWindow *)0x0) && (pIVar8->Window != (ImGuiWindow *)0x0)) {
            uVar37 = (ulong)(uint)(GImGui->Windows).Size;
            do {
              if ((int)uVar37 < 1) break;
              pIVar10 = (GImGui->Windows).Data[uVar37 - 1];
              if (pIVar10 == pIVar8->Window) goto LAB_002de4da;
              uVar37 = uVar37 - 1;
            } while (pIVar10 != pIVar24);
          }
          pIVar25 = GetViewportDrawList(pIVar8,1,"##Foreground");
          pIVar3 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + local_98._0_8_);
          local_a8._0_8_ = *pIVar3;
          IVar9 = pIVar3[1];
          fStack_9c = IVar9.y;
          local_a8._8_4_ = IVar9.x;
          fStack_9c = pIVar20->DimBgRatio * (GImGui->Style).Alpha * fStack_9c;
          IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
          IVar9 = (pIVar8->super_ImGuiViewport).Pos;
          IVar4 = (pIVar8->super_ImGuiViewport).Size;
          local_a8._4_4_ = IVar4.y + IVar9.y;
          local_a8._0_4_ = IVar4.x + IVar9.x;
          ImDrawList::AddRectFilled
                    (pIVar25,&(pIVar8->super_ImGuiViewport).Pos,(ImVec2 *)local_a8,IVar23,0.0,0xf);
          iVar42 = (pIVar20->Viewports).Size;
        }
LAB_002de4da:
        lVar39 = lVar39 + 1;
      } while (lVar39 < iVar42);
    }
    if ((local_78 != (ImVec2)0x0) &&
       (pIVar24 = pIVar20->NavWindowingTargetAnim, pIVar24->Active == true)) {
      pIVar10 = pIVar24->RootWindow;
      while (pIVar34 = pIVar10, iVar42 = (pIVar34->DC).ChildWindows.Size, 0 < iVar42) {
        iVar36 = iVar42 + 1;
        ppIVar26 = (pIVar34->DC).ChildWindows.Data + (iVar42 - 1);
        while ((pIVar10 = *ppIVar26, pIVar10->Active != true || (pIVar10->Hidden == true))) {
          iVar36 = iVar36 + -1;
          ppIVar26 = ppIVar26 + -1;
          if (iVar36 < 2) goto LAB_002de551;
        }
      }
LAB_002de551:
      pIVar25 = pIVar34->DrawList;
      ImDrawList::PushClipRectFullScreen(pIVar25);
      pIVar10 = pIVar24->RootWindowDockStop;
      if (((pIVar10->field_0x452 & 1) != 0) && (pIVar34 = pIVar24->RootWindow, pIVar34 != pIVar10))
      {
        local_78 = pIVar34->Pos;
        uStack_70 = 0;
        local_98._4_4_ = (pIVar34->Size).y + local_78.y;
        local_98._0_4_ = (pIVar34->Size).x + local_78.x;
        local_98._8_8_ = 0;
        local_58 = pIVar10->Pos;
        uStack_50 = 0;
        local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x35);
        uVar15 = (GImGui->Style).Colors[0x35].z;
        uVar16 = (GImGui->Style).Colors[0x35].w;
        local_48.y = (pIVar10->Size).y + local_58.y;
        local_48.x = (pIVar10->Size).x + local_58.x;
        uStack_40 = 0;
        fStack_9c = pIVar20->DimBgRatio * (GImGui->Style).Alpha * (float)uVar16;
        local_a8._8_4_ = uVar15;
        IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
        auVar13 = local_98;
        inner.Max = local_48;
        inner.Min = local_58;
        outer.Max.x = (float)local_98._0_4_;
        outer.Max.y = (float)local_98._4_4_;
        outer.Min = local_78;
        local_98 = auVar13;
        RenderRectFilledWithHole(pIVar25,outer,inner,IVar23,(pIVar20->Style).WindowRounding);
      }
      fVar44 = pIVar24->WindowRounding;
      fVar45 = (pIVar20->Style).WindowRounding;
      uVar41 = -(uint)(fVar45 <= fVar44);
      local_98 = ZEXT416(~uVar41 & (uint)fVar45 | uVar41 & (uint)fVar44);
      local_68.x = (pIVar24->Pos).x;
      local_68.y = (pIVar24->Pos).y;
      fVar46 = (pIVar24->Size).x + local_68.x;
      fVar47 = (pIVar24->Size).y + local_68.y;
      fVar45 = pIVar20->FontSize;
      local_68.x = local_68.x - fVar45;
      local_68.y = local_68.y - fVar45;
      IStack_60.x = fVar46 + fVar45;
      IStack_60.y = fVar47 + fVar45;
      pIVar8 = pIVar24->Viewport;
      IVar9 = (pIVar8->super_ImGuiViewport).Pos;
      fVar48 = IVar9.x;
      fVar49 = IVar9.y;
      if ((local_68.x <= fVar48) && (local_68.y <= fVar49)) {
        IVar9 = (pIVar8->super_ImGuiViewport).Size;
        iVar42 = -(uint)(fVar48 + IVar9.x <= fVar46 + fVar45);
        iVar36 = -(uint)(fVar49 + IVar9.y <= fVar47 + fVar45);
        auVar13._4_4_ = iVar42;
        auVar13._0_4_ = iVar42;
        auVar13._8_4_ = iVar36;
        auVar13._12_4_ = iVar36;
        uVar41 = movmskpd((int)pIVar8,auVar13);
        if (((uVar41 & 1) != 0) && ((byte)((byte)uVar41 >> 1) != 0)) {
          fVar45 = -1.0 - fVar45;
          local_68.x = local_68.x - fVar45;
          local_68.y = local_68.y - fVar45;
          IStack_60.x = fVar45 + IStack_60.x;
          IStack_60.y = fVar45 + IStack_60.y;
          local_98 = ZEXT416((uint)fVar44);
        }
      }
      local_a8._0_8_ = *(ImVec2 *)((GImGui->Style).Colors + 0x34);
      uVar17 = (GImGui->Style).Colors[0x34].z;
      uVar18 = (GImGui->Style).Colors[0x34].w;
      fStack_9c = pIVar20->NavWindowingHighlightAlpha * (GImGui->Style).Alpha * (float)uVar18;
      local_a8._8_4_ = uVar17;
      IVar23 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      ImDrawList::AddRect(pIVar25,&local_68,&IStack_60,IVar23,(float)local_98._0_4_,-1,3.0);
      ImDrawList::PopClipRect(pIVar25);
    }
  }
  pIVar20 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      IVar23 = ImHashStr("###NavWindowingList",0,0);
      pIVar24 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar20->WindowsById,IVar23);
      pIVar20->NavWindowingListWindow = pIVar24;
    }
    pIVar27 = GetMainViewport();
    pIVar19 = GImGui;
    IVar9.y = (pIVar27->Size).y * 0.2;
    IVar9.x = (pIVar27->Size).x * 0.2;
    (GImGui->NextWindowData).SizeConstraintRect.Min = IVar9;
    (pIVar19->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar19->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar19->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar19->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar9 = pIVar27->Pos;
    IVar4 = pIVar27->Size;
    (pIVar19->NextWindowData).Flags = (pIVar19->NextWindowData).Flags | 0x11;
    IVar12.y = IVar4.y * 0.5 + IVar9.y;
    IVar12.x = IVar4.x * 0.5 + IVar9.x;
    (pIVar19->NextWindowData).PosVal = IVar12;
    (pIVar19->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar19->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar19->NextWindowData).PosCond = 1;
    (pIVar19->NextWindowData).PosUndock = true;
    IVar9 = (pIVar20->Style).WindowPadding;
    fVar44 = IVar9.x;
    fVar45 = IVar9.y;
    local_a8._4_4_ = fVar45 + fVar45;
    local_a8._0_4_ = fVar44 + fVar44;
    PushStyleVar(1,(ImVec2 *)local_a8);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar39 = (long)(pIVar20->WindowsFocusOrder).Size;
    if (0 < lVar39) {
      do {
        if ((pIVar20->WindowsFocusOrder).Size < lVar39) goto LAB_002df266;
        pIVar24 = (pIVar20->WindowsFocusOrder).Data[lVar39 + -1];
        if (((pIVar24->Active == true) && (pIVar24->RootWindowDockStop == pIVar24)) &&
           (uVar41 = pIVar24->Flags, (uVar41 >> 0x13 & 1) == 0)) {
          pcVar33 = pIVar24->Name;
          pcVar32 = pcVar33;
          if (pcVar33 == (char *)0xffffffffffffffff) {
LAB_002de8f1:
            label = "(Popup)";
            if ((uVar41 >> 0x1a & 1) == 0) {
              if ((uVar41 >> 10 & 1) != 0) {
                iVar42 = strcmp(pcVar33,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar42 == 0) goto LAB_002de931;
              }
              label = "(Dock node)";
              if (pIVar24->DockNodeAsHost == (ImGuiDockNode *)0x0) {
                label = "(Untitled)";
              }
            }
          }
          else {
            do {
              if (*pcVar32 == '#') {
                if (pcVar32[1] == '#') goto LAB_002de8e7;
              }
              else if (*pcVar32 == '\0') goto LAB_002de8e7;
              pcVar32 = pcVar32 + 1;
            } while (pcVar32 != (char *)0xffffffffffffffff);
            pcVar32 = (char *)0xffffffffffffffff;
LAB_002de8e7:
            label = pcVar33;
            if (pcVar33 == pcVar32) goto LAB_002de8f1;
          }
LAB_002de931:
          local_a8._0_4_ = 0.0;
          local_a8._4_4_ = 0.0;
          Selectable(label,pIVar20->NavWindowingTarget == pIVar24,0,(ImVec2 *)local_a8);
        }
        bVar5 = 1 < lVar39;
        lVar39 = lVar39 + -1;
      } while (bVar5);
    }
    End();
    PopStyleVar(1);
  }
  pIVar19 = local_80;
  pIVar24 = pIVar20->NavWrapRequestWindow;
  if ((((pIVar24 != (ImGuiWindow *)0x0) && (pIVar20->NavWindow == pIVar24)) &&
      ((GImGui->NavMoveRequest == true &&
       (((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)))))) &&
     ((pIVar20->NavMoveRequestForward == ImGuiNavForward_None &&
      (pIVar20->NavLayer == ImGuiNavLayer_Main)))) {
    uVar41 = pIVar20->NavWrapRequestFlags;
    if (uVar41 == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x26c5,"void ImGui::NavEndFrame()");
    }
    local_a8._0_8_ = pIVar24->NavRectRel[0].Min;
    unique0x10000e39 = pIVar24->NavRectRel[0].Max;
    iVar42 = pIVar20->NavMoveDir;
    iVar36 = iVar42;
    if (iVar42 == 0) {
      if ((uVar41 & 5) == 0) goto LAB_002dec29;
      fVar44 = (pIVar24->SizeFull).x;
      fVar45 = (pIVar24->WindowPadding).x;
      fVar45 = fVar45 + fVar45 + (pIVar24->ContentSize).x;
      uVar43 = -(uint)(fVar45 <= fVar44);
      fVar44 = (float)(uVar43 & (uint)fVar44 | ~uVar43 & (uint)fVar45) - (pIVar24->Scroll).x;
      iVar36 = 0;
      if ((uVar41 & 4) != 0) {
        fVar45 = fStack_9c - (float)local_a8._4_4_;
        local_a8._4_4_ = (float)local_a8._4_4_ - fVar45;
        fStack_9c = fStack_9c - fVar45;
        iVar36 = 2;
      }
      local_a8._8_4_ = fVar44;
      local_a8._0_4_ = fVar44;
      NavMoveRequestForward(0,iVar36,(ImRect *)local_a8,uVar41);
      iVar42 = pIVar20->NavMoveDir;
    }
    if (iVar42 == 1 && (uVar41 & 5) != 0) {
      fVar44 = (pIVar24->Scroll).x;
      fVar45 = fStack_9c;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fStack_9c,fVar44) ^ 0x80000000);
      uVar21 = local_a8._4_4_;
      local_a8._0_8_ = CONCAT44(local_a8._4_4_,fVar44) ^ 0x80000000;
      if ((uVar41 & 4) != 0) {
        fVar44 = fVar45 - (float)uVar21;
        local_a8._4_4_ = (float)uVar21 + fVar44;
        fStack_9c = fVar44 + fVar45;
        iVar36 = 3;
      }
      NavMoveRequestForward(1,iVar36,(ImRect *)local_a8,uVar41);
      iVar42 = pIVar20->NavMoveDir;
    }
    if ((uVar41 & 10) != 0 && iVar42 == 2) {
      fVar44 = (pIVar24->SizeFull).y;
      fVar45 = (pIVar24->WindowPadding).y;
      fVar45 = fVar45 + fVar45 + (pIVar24->ContentSize).y;
      uVar43 = -(uint)(fVar45 <= fVar44);
      fVar44 = (float)(uVar43 & (uint)fVar44 | ~uVar43 & (uint)fVar45) - (pIVar24->Scroll).y;
      if ((uVar41 & 8) != 0) {
        fVar45 = (float)local_a8._8_4_ - (float)local_a8._0_4_;
        local_a8._0_4_ = (float)local_a8._0_4_ - fVar45;
        local_a8._8_4_ = (float)local_a8._8_4_ - fVar45;
        iVar36 = 0;
      }
      fStack_9c = fVar44;
      local_a8._4_4_ = fVar44;
      NavMoveRequestForward(2,iVar36,(ImRect *)local_a8,uVar41);
      iVar42 = pIVar20->NavMoveDir;
    }
    if (iVar42 == 3 && (uVar41 & 10) != 0) {
      fVar44 = (pIVar24->Scroll).y;
      uVar22 = local_a8._8_4_;
      stack0xffffffffffffff60 = (ImVec2)(CONCAT44(fVar44,local_a8._8_4_) ^ 0x8000000000000000);
      uVar21 = local_a8._0_4_;
      local_a8._0_8_ = CONCAT44(fVar44,local_a8._0_4_) ^ 0x8000000000000000;
      if ((uVar41 & 8) != 0) {
        fVar44 = (float)uVar22 - (float)uVar21;
        local_a8._0_4_ = (float)uVar21 + fVar44;
        local_a8._8_4_ = fVar44 + (float)uVar22;
        iVar36 = 1;
      }
      NavMoveRequestForward(3,iVar36,(ImRect *)local_a8,uVar41);
    }
  }
LAB_002dec29:
  pIVar20 = GImGui;
  if (GImGui->CurrentViewport != (ImGuiViewportP *)0x0) {
    GImGui->CurrentDpiScale = 1.0;
    pIVar20->CurrentViewport = (ImGuiViewportP *)0x0;
  }
  bVar31 = pIVar19->DragDropActive;
  iVar42 = pIVar19->FrameCount;
  if ((bool)bVar31 == true) {
    if ((pIVar19->DragDropPayload).DataFrameCount + 1 < iVar42) {
      if ((pIVar19->DragDropSourceFlags & 0x20) == 0) {
        if (4 < (ulong)(uint)pIVar19->DragDropMouseButton) {
          __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                        ,0x12da,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
        }
        bVar35 = (pIVar20->IO).MouseDown[(uint)pIVar19->DragDropMouseButton] ^ 1;
        goto LAB_002dec9e;
      }
    }
    else {
      bVar35 = 0;
LAB_002dec9e:
      if ((bVar35 == 0) && ((pIVar19->DragDropPayload).Delivery == false)) goto LAB_002decb8;
    }
    ClearDragDrop();
    bVar31 = pIVar19->DragDropActive;
    iVar42 = pIVar19->FrameCount;
  }
LAB_002decb8:
  if ((((bVar31 & 1) != 0) && (pIVar19->DragDropSourceFrameCount < iVar42)) &&
     ((pIVar19->DragDropSourceFlags & 1) == 0)) {
    pIVar19->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar19->DragDropWithinSource = false;
    iVar42 = pIVar19->FrameCount;
  }
  pIVar19->WithinFrameScope = false;
  pIVar19->FrameCountEnded = iVar42;
  UpdateMouseMovingWindowEndFrame();
  pIVar20 = GImGui;
  if (0 < (GImGui->Viewports).Size) {
    (GImGui->PlatformIO).MainViewport = &(*(GImGui->Viewports).Data)->super_ImGuiViewport;
    if ((pIVar20->PlatformIO).Viewports.Capacity < 0) {
      piVar1 = &(pIVar20->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      ppIVar28 = (ImGuiViewport **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      ppIVar29 = (pIVar20->PlatformIO).Viewports.Data;
      if (ppIVar29 != (ImGuiViewport **)0x0) {
        memcpy(ppIVar28,ppIVar29,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
        ppIVar29 = (pIVar20->PlatformIO).Viewports.Data;
        if ((ppIVar29 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar29,GImAllocatorUserData);
      }
      (pIVar20->PlatformIO).Viewports.Data = ppIVar28;
      iVar42 = (pIVar20->Viewports).Size;
      (pIVar20->PlatformIO).Viewports.Size = 0;
      (pIVar20->PlatformIO).Viewports.Capacity = 0;
      if (iVar42 < 1) goto LAB_002df285;
    }
    else {
      (pIVar20->PlatformIO).Viewports.Size = 0;
    }
    lVar39 = 0;
    do {
      pIVar8 = (pIVar20->Viewports).Data[lVar39];
      pIVar8->LastPos = (pIVar8->super_ImGuiViewport).Pos;
      if ((pIVar8->LastFrameActive < pIVar20->FrameCount) ||
         ((pIVar8->super_ImGuiViewport).Size.x <= 0.0)) {
        if (lVar39 == 0) {
          pIVar24 = pIVar8->Window;
          if (pIVar24 != (ImGuiWindow *)0x0) goto LAB_002dee33;
          goto LAB_002dee4d;
        }
      }
      else if ((lVar39 == 0) || (0.0 < (pIVar8->super_ImGuiViewport).Size.y)) {
        pIVar24 = pIVar8->Window;
        if (pIVar24 == (ImGuiWindow *)0x0) {
          if (lVar39 != 0) {
            __assert_fail("viewport->Window != __null",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                          ,0x2cad,"void ImGui::UpdateViewportsEndFrame()");
          }
        }
        else {
LAB_002dee33:
          if ((pIVar24->Active != true) || (pIVar24->Hidden != false)) goto LAB_002def25;
        }
LAB_002dee4d:
        iVar42 = (pIVar20->PlatformIO).Viewports.Size;
        if (iVar42 == (pIVar20->PlatformIO).Viewports.Capacity) {
          if (iVar42 == 0) {
            iVar36 = 8;
          }
          else {
            iVar36 = iVar42 / 2 + iVar42;
          }
          iVar14 = iVar42 + 1;
          if (iVar42 + 1 < iVar36) {
            iVar14 = iVar36;
          }
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          ppIVar29 = (ImGuiViewport **)
                     (*GImAllocatorAllocFunc)((long)iVar14 << 3,GImAllocatorUserData);
          ppIVar28 = (pIVar20->PlatformIO).Viewports.Data;
          if (ppIVar28 != (ImGuiViewport **)0x0) {
            memcpy(ppIVar29,ppIVar28,(long)(pIVar20->PlatformIO).Viewports.Size << 3);
            ppIVar28 = (pIVar20->PlatformIO).Viewports.Data;
            if ((ppIVar28 != (ImGuiViewport **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(ppIVar28,GImAllocatorUserData);
          }
          (pIVar20->PlatformIO).Viewports.Data = ppIVar29;
          (pIVar20->PlatformIO).Viewports.Capacity = iVar14;
          iVar42 = (pIVar20->PlatformIO).Viewports.Size;
        }
        else {
          ppIVar29 = (pIVar20->PlatformIO).Viewports.Data;
        }
        ppIVar29[iVar42] = &pIVar8->super_ImGuiViewport;
        pIVar2 = &(pIVar20->PlatformIO).Viewports;
        pIVar2->Size = pIVar2->Size + 1;
      }
LAB_002def25:
      pIVar19 = local_80;
      lVar39 = lVar39 + 1;
      iVar42 = (pIVar20->Viewports).Size;
    } while (lVar39 < iVar42);
    if (0 < iVar42) {
      pIVar8 = *(pIVar20->Viewports).Data;
      (pIVar8->super_ImGuiViewport).PlatformRequestMove = false;
      (pIVar8->super_ImGuiViewport).PlatformRequestResize = false;
      (pIVar8->super_ImGuiViewport).PlatformRequestClose = false;
      iVar42 = (local_80->WindowsTempSortBuffer).Capacity;
      if (iVar42 < 0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        iVar42 = 0;
        ppIVar30 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        ppIVar26 = (pIVar19->WindowsTempSortBuffer).Data;
        if (ppIVar26 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar30,ppIVar26,(long)(pIVar19->WindowsTempSortBuffer).Size << 3);
          ppIVar26 = (pIVar19->WindowsTempSortBuffer).Data;
          if ((ppIVar26 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar26,GImAllocatorUserData);
        }
        (pIVar19->WindowsTempSortBuffer).Data = ppIVar30;
        (pIVar19->WindowsTempSortBuffer).Capacity = 0;
      }
      (pIVar19->WindowsTempSortBuffer).Size = 0;
      uVar41 = (pIVar19->Windows).Size;
      uVar37 = (ulong)uVar41;
      if (iVar42 < (int)uVar41) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar30 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar37 * 8,GImAllocatorUserData);
        ppIVar26 = (pIVar19->WindowsTempSortBuffer).Data;
        if (ppIVar26 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar30,ppIVar26,(long)(pIVar19->WindowsTempSortBuffer).Size << 3);
          ppIVar26 = (pIVar19->WindowsTempSortBuffer).Data;
          if ((ppIVar26 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar26,GImAllocatorUserData);
        }
        (pIVar19->WindowsTempSortBuffer).Data = ppIVar30;
        (pIVar19->WindowsTempSortBuffer).Capacity = uVar41;
        uVar37 = (ulong)(uint)(pIVar19->Windows).Size;
      }
      if ((int)uVar37 == 0) {
        iVar42 = 0;
      }
      else {
        uVar38 = 0;
        do {
          if ((long)(int)uVar37 <= (long)uVar38) goto LAB_002df266;
          pIVar24 = (pIVar19->Windows).Data[uVar38];
          if ((pIVar24->Active != true) || ((pIVar24->Flags & 0x1000000) == 0)) {
            AddWindowToSortBuffer(&pIVar19->WindowsTempSortBuffer,pIVar24);
            uVar37 = (ulong)(uint)(pIVar19->Windows).Size;
          }
          uVar38 = uVar38 + 1;
          iVar42 = (int)uVar37;
        } while (uVar38 != uVar37);
      }
      if (iVar42 == (pIVar19->WindowsTempSortBuffer).Size) {
        (pIVar19->Windows).Size = iVar42;
        iVar42 = (pIVar19->WindowsTempSortBuffer).Capacity;
        (pIVar19->WindowsTempSortBuffer).Capacity = (pIVar19->Windows).Capacity;
        (pIVar19->Windows).Capacity = iVar42;
        ppIVar26 = (pIVar19->WindowsTempSortBuffer).Data;
        (pIVar19->WindowsTempSortBuffer).Data = (pIVar19->Windows).Data;
        (pIVar19->Windows).Data = ppIVar26;
        (pIVar19->IO).MetricsActiveWindows = pIVar19->WindowsActiveCount;
        ((pIVar19->IO).Fonts)->Locked = false;
        (pIVar19->IO).MouseWheel = 0.0;
        (pIVar19->IO).MouseWheelH = 0.0;
        if ((pIVar19->IO).InputQueueCharacters.Capacity < 0) {
          if (GImGui != (ImGuiContext *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + 1;
          }
          __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
          puVar11 = (pIVar19->IO).InputQueueCharacters.Data;
          if (puVar11 != (unsigned_short *)0x0) {
            memcpy(__dest,puVar11,(long)(pIVar19->IO).InputQueueCharacters.Size * 2);
            puVar11 = (pIVar19->IO).InputQueueCharacters.Data;
            if ((puVar11 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
              piVar1 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar1 = *piVar1 + -1;
            }
            (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
          }
          (pIVar19->IO).InputQueueCharacters.Data = __dest;
          (pIVar19->IO).InputQueueCharacters.Capacity = 0;
        }
        (pIVar19->IO).InputQueueCharacters.Size = 0;
        (pIVar19->IO).NavInputs[0] = 0.0;
        (pIVar19->IO).NavInputs[1] = 0.0;
        (pIVar19->IO).NavInputs[2] = 0.0;
        (pIVar19->IO).NavInputs[3] = 0.0;
        (pIVar19->IO).NavInputs[4] = 0.0;
        (pIVar19->IO).NavInputs[5] = 0.0;
        (pIVar19->IO).NavInputs[6] = 0.0;
        (pIVar19->IO).NavInputs[7] = 0.0;
        (pIVar19->IO).NavInputs[8] = 0.0;
        (pIVar19->IO).NavInputs[9] = 0.0;
        (pIVar19->IO).NavInputs[10] = 0.0;
        (pIVar19->IO).NavInputs[0xb] = 0.0;
        (pIVar19->IO).NavInputs[0xc] = 0.0;
        (pIVar19->IO).NavInputs[0xd] = 0.0;
        (pIVar19->IO).NavInputs[0xe] = 0.0;
        (pIVar19->IO).NavInputs[0xf] = 0.0;
        (pIVar19->IO).NavInputs[0x10] = 0.0;
        (pIVar19->IO).NavInputs[0x11] = 0.0;
        (pIVar19->IO).NavInputs[0x12] = 0.0;
        (pIVar19->IO).NavInputs[0x13] = 0.0;
        (pIVar19->IO).NavInputs[0x14] = 0.0;
        iVar42 = (pIVar19->Hooks).Size;
        if (0 < iVar42) {
          lVar39 = 0;
          lVar40 = 0;
          do {
            pIVar6 = (pIVar19->Hooks).Data;
            if (*(int *)(pIVar6 + lVar39) == 3) {
              (**(code **)(pIVar6 + lVar39 + 8))(pIVar19,pIVar6 + lVar39);
              iVar42 = (pIVar19->Hooks).Size;
            }
            lVar40 = lVar40 + 1;
            lVar39 = lVar39 + 0x18;
          } while (lVar40 < iVar42);
        }
        return;
      }
      __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                    ,0x11d2,"void ImGui::EndFrame()");
    }
  }
LAB_002df285:
  pcVar33 = "T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]";
LAB_002df27b:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                ,0x688,pcVar33);
LAB_002df266:
  pcVar33 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
  goto LAB_002df27b;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.PlatformIO.Platform_SetImeInputPos && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImePos - g.PlatformImeLastPos) > 0.0001f))
        if (g.PlatformImePosViewport && g.PlatformImePosViewport->PlatformWindowCreated)
        {
            g.PlatformIO.Platform_SetImeInputPos(g.PlatformImePosViewport, g.PlatformImePos);
            g.PlatformImeLastPos = g.PlatformImePos;
            g.PlatformImePosViewport = NULL;
        }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Draw modal whitening background on _other_ viewports than the one the modal is one
    EndFrameDrawDimmedBackgrounds();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    SetCurrentViewport(NULL, NULL);

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Update user-facing viewport list (g.Viewports -> g.PlatformIO.Viewports after filtering out some)
    UpdateViewportsEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}